

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KInstPrinter.c
# Opt level: O1

char * M68K_reg_name(csh handle,uint reg)

{
  if (0x2e < reg) {
    return (char *)0x0;
  }
  return s_reg_names[reg];
}

Assistant:

const char* M68K_reg_name(csh handle, unsigned int reg)
{
#ifdef CAPSTONE_DIET
	return NULL;
#else
	if (reg >= ARR_SIZE(s_reg_names)) {
		return NULL;
	}
	return s_reg_names[(int)reg];
#endif
}